

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# POSG.cpp
# Opt level: O0

string * __thiscall POSG::SoftPrint_abi_cxx11_(POSG *this)

{
  ostream *poVar1;
  string *in_RDI;
  stringstream ss;
  string local_1e8 [32];
  string local_1c8 [48];
  stringstream local_198 [16];
  ostream local_188 [336];
  vector<Globals::reward_t,_std::allocator<Globals::reward_t>_> *in_stack_ffffffffffffffc8;
  
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = std::operator<<(local_188,"Discount factors: ");
  PrintTools::SoftPrintVector<double>
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffffc8);
  poVar1 = std::operator<<(poVar1,local_1c8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_1c8);
  poVar1 = std::operator<<(local_188,"Reward type: ");
  PrintTools::SoftPrintVector<Globals::reward_t>(in_stack_ffffffffffffffc8);
  poVar1 = std::operator<<(poVar1,local_1e8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

string POSG::SoftPrint() const
{
    stringstream ss;
    ss << "Discount factors: " << 
        PrintTools::SoftPrintVector(_m_discount) << endl;
    ss << "Reward type: " << 
        PrintTools::SoftPrintVector(_m_rewardType) << endl;
    return ss.str();
}